

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_compare.hpp
# Opt level: O1

bool jessilib::equalsi<char8_t,char8_t>
               (basic_string_view<char8_t,_std::char_traits<char8_t>_> lhs,
               basic_string_view<char8_t,_std::char_traits<char8_t>_> rhs)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  jessilib *pjVar4;
  jessilib *extraout_RDX;
  jessilib *this;
  jessilib *this_00;
  decode_result dVar6;
  decode_result dVar7;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_string_00;
  char8_t *local_40;
  char8_t *local_38;
  jessilib *pjVar5;
  
  local_40 = lhs._M_str;
  this_00 = (jessilib *)lhs._M_len;
  local_38 = rhs._M_str;
  pjVar4 = (jessilib *)rhs._M_len;
  this = pjVar4;
  if (this_00 == pjVar4) {
    do {
      if ((this_00 == (jessilib *)0x0) || (this == (jessilib *)0x0)) {
        return this_00 == (jessilib *)0x0 && this == (jessilib *)0x0;
      }
      in_string._M_str = (char8_t *)pjVar4;
      in_string._M_len = (size_t)local_40;
      dVar6 = decode_codepoint_utf8<char8_t>(this_00,in_string);
      in_string_00._M_str = (char8_t *)dVar6.units;
      in_string_00._M_len = (size_t)local_38;
      dVar7 = decode_codepoint_utf8<char8_t>(this,in_string_00);
      pjVar5 = (jessilib *)dVar7.units;
      pjVar4 = pjVar5;
      bVar1 = false;
      if ((in_string_00._M_str != (char8_t *)0x0) && (bVar1 = false, pjVar5 != (jessilib *)0x0)) {
        if (dVar6.codepoint != dVar7.codepoint) {
          iVar2 = jessilib::fold(dVar6.codepoint);
          iVar3 = jessilib::fold(dVar7.codepoint);
          pjVar4 = extraout_RDX;
          if (iVar2 != iVar3) {
            bVar1 = false;
            goto LAB_00230b42;
          }
        }
        local_40 = local_40 + (long)in_string_00._M_str;
        this_00 = this_00 + -(long)in_string_00._M_str;
        local_38 = local_38 + (long)pjVar5;
        this = this + -(long)pjVar5;
        bVar1 = true;
      }
LAB_00230b42:
    } while (bVar1);
  }
  return false;
}

Assistant:

bool equalsi(std::basic_string_view<LhsCharT> lhs, std::basic_string_view<RhsCharT> rhs) {
	// If lhs and rhs are the same type, compare their sizes and quickly return if not same
	if constexpr (std::is_same_v<LhsCharT, RhsCharT>) {
		if (lhs.size() != rhs.size()) {
			return false;
		}
	}

	while (!lhs.empty() && !rhs.empty()) {
		auto lhs_front = decode_codepoint(lhs);
		auto rhs_front = decode_codepoint(rhs);

		if (lhs_front.units == 0
			|| rhs_front.units == 0) {
			// Failed to decode front codepoint; bad unicode sequence
			return false;
		}

		if (!equalsi(lhs_front.codepoint, rhs_front.codepoint)) {
			// Codepoints don't fold to same value
			return false;
		}

		// Codepoints are equal; trim off the fronts and continue
		lhs.remove_prefix(lhs_front.units);
		rhs.remove_prefix(rhs_front.units);
	}

	return lhs.empty() && rhs.empty();
}